

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

void Mf_ObjMergeOrder(Mf_Man_t *p,int iObj)

{
  int *pVars;
  float fVar1;
  ushort uVar2;
  uint uVar3;
  uint nCutNum;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  Mf_Obj_t *pMVar7;
  Gia_Man_t *pGVar8;
  undefined8 uVar9;
  Jf_Par_t *pJVar10;
  Mf_Obj_t *pMVar11;
  Gia_Obj_t *pGVar12;
  Mf_Cut_t *pMVar13;
  Mf_Cut_t *pMVar14;
  Vec_Mem_t *pVVar15;
  word **ppwVar16;
  word *pwVar17;
  word *pwVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  void *pvVar25;
  void **ppvVar26;
  byte bVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  int iVar35;
  ulong *puVar36;
  long lVar37;
  uint uVar38;
  uint *puVar39;
  int *piVar40;
  uint uVar41;
  uint uVar42;
  Mf_Cut_t *pMVar43;
  ulong uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  word *pwVar52;
  uint uVar53;
  int iVar54;
  long lVar55;
  int *piVar56;
  ulong *puVar57;
  int iVar58;
  uint uVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  float fVar63;
  word uTruth [16];
  word uTruth0 [16];
  Mf_Cut_t *pCutsR [16];
  word uTruth1 [16];
  word uRes [4];
  Mf_Cut_t pCuts2 [16];
  Mf_Cut_t pCuts1 [16];
  Mf_Cut_t pCuts0 [16];
  Mf_Cut_t pCuts [16];
  ulong *local_1388;
  ulong *local_1368;
  ulong local_12f8 [16];
  ulong local_1278;
  ulong local_1270;
  ulong local_1268;
  ulong local_1260;
  word local_1258 [16];
  Mf_Cut_t *local_11d8 [16];
  ulong local_1158 [16];
  word local_10d8 [16];
  word local_1058 [4];
  ulong local_1038 [2];
  uint local_1028;
  uint uStack_1024;
  ulong uStack_1020;
  ulong local_c38 [2];
  uint local_c28;
  int local_c24 [251];
  ulong local_838 [2];
  uint local_828;
  int local_824 [251];
  Mf_Cut_t local_438 [16];
  
  if ((iObj < 0) || (p->pGia->nObjs <= iObj)) {
LAB_006e0ee6:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar6 = p->pGia->pObjs;
  pMVar7 = p->pLfObjs;
  uVar3 = p->pPars->nLutSize;
  nCutNum = p->pPars->nCutNum;
  iVar28 = iObj - (*(uint *)(pGVar6 + (uint)iObj) & 0x1fffffff);
  iVar58 = pMVar7[iVar28].iCutSet;
  if (iVar58 == 0) {
    local_838[1] = 0;
    local_828 = 0x8000002;
    local_824[0] = iVar28;
    local_838[0] = 1L << ((byte)iVar28 & 0x3f);
    iVar35 = 1;
  }
  else {
    uVar45 = iVar58 >> 0x10;
    if (((int)uVar45 < 0) || ((p->vPages).nSize <= (int)uVar45)) goto LAB_006e0ec7;
    pvVar25 = (p->vPages).pArray[uVar45];
    iVar35 = *(int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
    if (iVar35 < 1) {
      puVar36 = local_838;
    }
    else {
      piVar56 = (int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
      puVar39 = (uint *)(piVar56 + 1);
      puVar36 = local_838;
      iVar58 = 0;
      do {
        puVar36[1] = 0;
        uVar45 = *puVar39;
        *(uint *)(puVar36 + 2) = (uint)puVar36[2] & 0xf8000000 | uVar45 >> 5;
        *(uint *)(puVar36 + 2) = *puVar39 << 0x1b | uVar45 >> 5;
        uVar45 = *puVar39 & 0x1f;
        if (uVar45 == 0) {
          uVar23 = 0;
        }
        else {
          uVar29 = 0;
          uVar23 = 0;
          do {
            uVar23 = uVar23 | 1L << ((ulong)(byte)(puVar39 + 1)[uVar29] & 0x3f);
            uVar29 = uVar29 + 1;
          } while (uVar45 != uVar29);
        }
        *puVar36 = uVar23;
        memcpy((void *)((long)puVar36 + 0x14),puVar39 + 1,(ulong)(uVar45 << 2));
        puVar36 = puVar36 + 8;
        iVar58 = iVar58 + 1;
        puVar39 = puVar39 + (ulong)(*puVar39 & 0x1f) + 1;
        iVar35 = *piVar56;
      } while (iVar58 < iVar35);
    }
    if (0xfffffff < local_828) {
      puVar36[1] = 0;
      *(undefined4 *)(puVar36 + 2) = 0x8000002;
      *(int *)((long)puVar36 + 0x14) = iVar28;
      *puVar36 = 1L << ((byte)iVar28 & 0x3f);
      iVar35 = iVar35 + 1;
    }
  }
  pGVar6 = pGVar6 + (uint)iObj;
  iVar28 = iObj - (*(uint *)&pGVar6->field_0x4 & 0x1fffffff);
  iVar58 = p->pLfObjs[iVar28].iCutSet;
  if (iVar58 == 0) {
    local_c38[1] = 0;
    local_c28 = 0x8000002;
    local_c24[0] = iVar28;
    local_c38[0] = 1L << ((byte)iVar28 & 0x3f);
    iVar31 = 1;
  }
  else {
    uVar45 = iVar58 >> 0x10;
    if (((int)uVar45 < 0) || ((p->vPages).nSize <= (int)uVar45)) goto LAB_006e0ec7;
    pvVar25 = (p->vPages).pArray[uVar45];
    iVar31 = *(int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
    if (iVar31 < 1) {
      puVar36 = local_c38;
    }
    else {
      piVar56 = (int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
      puVar39 = (uint *)(piVar56 + 1);
      puVar36 = local_c38;
      iVar58 = 0;
      do {
        puVar36[1] = 0;
        uVar45 = *puVar39;
        *(uint *)(puVar36 + 2) = (uint)puVar36[2] & 0xf8000000 | uVar45 >> 5;
        *(uint *)(puVar36 + 2) = *puVar39 << 0x1b | uVar45 >> 5;
        uVar45 = *puVar39 & 0x1f;
        if (uVar45 == 0) {
          uVar23 = 0;
        }
        else {
          uVar29 = 0;
          uVar23 = 0;
          do {
            uVar23 = uVar23 | 1L << ((ulong)(byte)(puVar39 + 1)[uVar29] & 0x3f);
            uVar29 = uVar29 + 1;
          } while (uVar45 != uVar29);
        }
        *puVar36 = uVar23;
        memcpy((void *)((long)puVar36 + 0x14),puVar39 + 1,(ulong)(uVar45 << 2));
        puVar36 = puVar36 + 8;
        iVar58 = iVar58 + 1;
        puVar39 = puVar39 + (ulong)(*puVar39 & 0x1f) + 1;
        iVar31 = *piVar56;
      } while (iVar58 < iVar31);
    }
    if (0xfffffff < local_c28) {
      puVar36[1] = 0;
      *(undefined4 *)(puVar36 + 2) = 0x8000002;
      *(int *)((long)puVar36 + 0x14) = iVar28;
      *puVar36 = 1L << ((byte)iVar28 & 0x3f);
      iVar31 = iVar31 + 1;
    }
  }
  pGVar8 = p->pGia;
  if (pGVar8->pSibls == (int *)0x0) {
    uVar45 = 0;
  }
  else {
    uVar45 = pGVar8->pSibls[(uint)iObj];
  }
  if (0 < (int)nCutNum) {
    pMVar43 = local_438;
    uVar23 = 0;
    do {
      local_11d8[uVar23] = pMVar43;
      uVar23 = uVar23 + 1;
      pMVar43 = pMVar43 + 1;
    } while (nCutNum != uVar23);
  }
  uVar23 = *(ulong *)pGVar6;
  pMVar7 = pMVar7 + (uint)iObj;
  if (uVar45 == 0) {
    uVar29 = 0;
  }
  else {
    iVar58 = pGVar8->pSibls[(uint)iObj];
    if (((long)iVar58 < 0) || (pGVar8->nObjs <= iVar58)) goto LAB_006e0ee6;
    uVar9 = *(undefined8 *)(pGVar8->pObjs + iVar58);
    uVar29 = *(ulong *)pGVar6;
    iVar58 = p->pLfObjs[(int)uVar45].iCutSet;
    if (iVar58 == 0) {
      local_1038[1] = 0;
      local_1028 = 0x8000002;
      uStack_1024 = uVar45;
      local_1038[0] = 1L << ((byte)uVar45 & 0x3f);
      iVar28 = 1;
    }
    else {
      uVar45 = iVar58 >> 0x10;
      if (((int)uVar45 < 0) || ((p->vPages).nSize <= (int)uVar45)) goto LAB_006e0ec7;
      pvVar25 = (p->vPages).pArray[uVar45];
      iVar28 = *(int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
      if (0 < iVar28) {
        piVar56 = (int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
        puVar39 = (uint *)(piVar56 + 1);
        puVar36 = local_1038;
        iVar58 = 0;
        do {
          puVar36[1] = 0;
          uVar45 = *puVar39;
          *(uint *)(puVar36 + 2) = (uint)puVar36[2] & 0xf8000000 | uVar45 >> 5;
          *(uint *)(puVar36 + 2) = *puVar39 << 0x1b | uVar45 >> 5;
          uVar45 = *puVar39 & 0x1f;
          if (uVar45 == 0) {
            uVar24 = 0;
          }
          else {
            uVar30 = 0;
            uVar24 = 0;
            do {
              uVar24 = uVar24 | 1L << ((ulong)(byte)(puVar39 + 1)[uVar30] & 0x3f);
              uVar30 = uVar30 + 1;
            } while (uVar45 != uVar30);
          }
          *puVar36 = uVar24;
          memcpy((void *)((long)puVar36 + 0x14),puVar39 + 1,(ulong)(uVar45 << 2));
          puVar36 = puVar36 + 8;
          iVar58 = iVar58 + 1;
          puVar39 = puVar39 + (ulong)(*puVar39 & 0x1f) + 1;
          iVar28 = *piVar56;
        } while (iVar58 < iVar28);
      }
    }
    if (iVar28 < 1) {
      uVar45 = 0;
    }
    else {
      puVar36 = local_1038;
      uVar45 = 0;
      do {
        pMVar43 = local_11d8[(int)uVar45];
        uVar24 = *puVar36;
        uVar30 = puVar36[1];
        uVar44 = puVar36[3];
        uVar34 = puVar36[4];
        uVar19 = puVar36[5];
        uVar20 = puVar36[6];
        uVar21 = puVar36[7];
        *(ulong *)&pMVar43->field_0x10 = puVar36[2];
        *(ulong *)(pMVar43->pLeaves + 1) = uVar44;
        *(ulong *)(pMVar43->pLeaves + 7) = uVar20;
        *(ulong *)(pMVar43->pLeaves + 9) = uVar21;
        *(ulong *)(pMVar43->pLeaves + 3) = uVar34;
        *(ulong *)(pMVar43->pLeaves + 5) = uVar19;
        pMVar43->Sign = uVar24;
        pMVar43->Delay = (int)uVar30;
        pMVar43->Flow = (float)(int)(uVar30 >> 0x20);
        uVar41 = *(uint *)&pMVar43->field_0x10;
        *(uint *)&pMVar43->field_0x10 =
             uVar41 & 0xf8000000 |
             uVar41 & 0x7ffffff ^ ((uint)((ulong)uVar9 >> 0x20) ^ (uint)(uVar29 >> 0x20)) >> 0x1f;
        uVar53 = uVar41 >> 0x1b;
        pJVar10 = p->pPars;
        if (pJVar10->nLutSize < (int)uVar53) {
LAB_006e0cd7:
          __assert_fail("nLeaves <= p->pPars->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                        ,0x3ba,"void Mf_CutParams(Mf_Man_t *, Mf_Cut_t *, float)");
        }
        fVar1 = pMVar7->nFlowRefs;
        pMVar43->Delay = 0;
        pMVar43->Flow = 0.0;
        if (0x7ffffff < uVar41) {
          pMVar11 = p->pLfObjs;
          uVar24 = 0;
          fVar63 = 0.0;
          uVar42 = 0;
          do {
            iVar58 = pMVar43->pLeaves[uVar24];
            uVar2 = *(ushort *)&pMVar11[iVar58].field_0xc;
            if (uVar42 <= uVar2) {
              uVar42 = (uint)uVar2;
            }
            pMVar43->Delay = uVar42;
            fVar63 = fVar63 + pMVar11[iVar58].Flow;
            pMVar43->Flow = fVar63;
            uVar24 = uVar24 + 1;
          } while (uVar53 != uVar24);
        }
        pMVar43->Delay = (pMVar43->Delay + 1) - (uint)(uVar41 < 0x10000000);
        if (uVar41 < 0x10000000) {
          iVar58 = 0;
        }
        else if (pJVar10->fGenCnf == 0) {
          if (pJVar10->fOptEdge == 0) {
            iVar58 = 1;
          }
          else {
            iVar58 = uVar53 + pJVar10->nAreaTuner;
          }
        }
        else {
          uVar41 = uVar41 >> 1 & 0x3ffffff;
          if ((p->vCnfSizes).nSize <= (int)uVar41) {
LAB_006e0d53:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar58 = (p->vCnfSizes).pArray[uVar41];
        }
        pMVar43->Flow = (pMVar43->Flow + (float)iVar58) / fVar1;
        uVar45 = Mf_SetAddCut(local_11d8,uVar45,nCutNum);
        puVar36 = puVar36 + 8;
      } while (puVar36 < local_1038 + (long)iVar28 * 8);
    }
    uVar29 = (ulong)uVar45;
  }
  uVar45 = (uint)(uVar23 >> 0x1d) & 1;
  uVar41 = (uint)(uVar23 >> 0x3d) & 1;
  puVar39 = p->pGia->pMuxes;
  if ((puVar39 == (uint *)0x0) || (puVar39[(uint)iObj] == 0)) {
    uVar53 = (uint)*(ulong *)pGVar6;
    bVar62 = (~uVar53 & 0x1fffffff) != 0;
    bVar61 = (uVar53 & 0x1fffffff) < ((uint)(*(ulong *)pGVar6 >> 0x20) & 0x1fffffff);
    p->CutCount[0] = (double)(iVar31 * iVar35) + p->CutCount[0];
    if (0 < iVar35) {
      local_1368._0_4_ = uVar3 << 0x1b | 0x7ffffff;
      piVar56 = local_824;
      local_1388 = local_838;
      do {
        if (0 < iVar31) {
          piVar40 = local_c24;
          puVar36 = local_c38;
          do {
            uVar42 = (uint)local_1388[2];
            uVar59 = uVar42 >> 0x1b;
            uVar23 = puVar36[2];
            uVar46 = (uint)uVar23 >> 0x1b;
            if (((int)uVar3 < (int)(uVar46 + uVar59)) &&
               (uVar24 = (*puVar36 | *local_1388) -
                         ((*puVar36 | *local_1388) >> 1 & 0x5555555555555555),
               uVar24 = (uVar24 >> 2 & 0x3333333333333333) + (uVar24 & 0x3333333333333333),
               (int)uVar3 <
               (int)(uint)(byte)(((uVar24 >> 4) + uVar24 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                0x38))) goto LAB_006dfa32;
            p->CutCount[1] = p->CutCount[1] + 1.0;
            iVar58 = (int)uVar29;
            pMVar43 = local_11d8[iVar58];
            pVars = pMVar43->pLeaves;
            if ((uVar59 != uVar3) || (uVar46 != uVar3)) {
              iVar28 = 0;
              iVar32 = 0;
              if (uVar42 < 0x8000000) {
LAB_006dee4f:
                if ((int)(iVar32 + uVar46) <= (int)(uVar3 + iVar28)) {
                  if (iVar28 < (int)uVar46) {
                    lVar55 = 0;
                    do {
                      pMVar43->pLeaves[iVar32 + lVar55] = piVar40[iVar28 + lVar55];
                      lVar55 = lVar55 + 1;
                    } while ((ulong)uVar46 - (long)iVar28 != lVar55);
LAB_006deef4:
                    iVar32 = iVar32 + (int)lVar55;
                  }
LAB_006deef6:
                  *(uint *)&pMVar43->field_0x10 = iVar32 << 0x1b | 0x7ffffff;
                  goto LAB_006def04;
                }
              }
              else {
                iVar49 = 0;
                iVar32 = 0;
                if ((uint)uVar23 < 0x8000000) {
LAB_006deeac:
                  if ((int)(iVar32 + uVar59) <= (int)(uVar3 + iVar49)) {
                    if (iVar49 < (int)uVar59) {
                      lVar55 = 0;
                      do {
                        pMVar43->pLeaves[iVar32 + lVar55] = piVar56[iVar49 + lVar55];
                        lVar55 = lVar55 + 1;
                      } while ((ulong)uVar59 - (long)iVar49 != lVar55);
                      goto LAB_006deef4;
                    }
                    goto LAB_006deef6;
                  }
                }
                else if ((ulong)uVar3 != 0) {
                  lVar55 = 0;
                  iVar49 = 0;
                  iVar32 = 0;
                  do {
                    iVar28 = *(int *)((long)local_1388 + (long)iVar49 * 4 + 0x14);
                    iVar33 = *(int *)((long)puVar36 + (long)iVar32 * 4 + 0x14);
                    if (iVar28 < iVar33) {
                      iVar49 = iVar49 + 1;
                      pVars[lVar55] = iVar28;
                      iVar28 = iVar32;
                      if ((int)uVar59 <= iVar49) {
LAB_006df753:
                        iVar32 = (int)lVar55 + 1;
                        goto LAB_006dee4f;
                      }
                    }
                    else {
                      if (iVar33 < iVar28) {
                        pVars[lVar55] = iVar33;
                      }
                      else {
                        iVar49 = iVar49 + 1;
                        pVars[lVar55] = iVar28;
                        iVar28 = iVar32 + 1;
                        if ((int)uVar59 <= iVar49) goto LAB_006df753;
                      }
                      iVar32 = iVar32 + 1;
                      if ((int)uVar46 <= iVar32) {
                        iVar32 = (int)lVar55 + 1;
                        goto LAB_006deeac;
                      }
                    }
                    lVar55 = lVar55 + 1;
                  } while (uVar3 != (uint)lVar55);
                }
              }
              goto LAB_006dfa32;
            }
            if (0x7ffffff < uVar42) {
              uVar23 = 0;
              do {
                if (piVar56[uVar23] != piVar40[uVar23]) goto LAB_006dfa32;
                pVars[uVar23] = piVar56[uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar59 != uVar23);
            }
            *(uint *)&pMVar43->field_0x10 = (uint)local_1368;
LAB_006def04:
            pMVar43->Sign = *puVar36 | *local_1388;
            if (0 < iVar58) {
              pMVar13 = local_11d8[uVar29];
              uVar42 = *(uint *)&pMVar13->field_0x10 >> 0x1b;
              uVar23 = 0;
              do {
                pMVar14 = local_11d8[uVar23];
                uVar46 = *(uint *)&pMVar14->field_0x10 >> 0x1b;
                if ((uVar46 <= uVar42) && ((pMVar14->Sign & ~pMVar13->Sign) == 0)) {
                  if (uVar42 == uVar46) {
                    if (*(uint *)&pMVar13->field_0x10 < 0x8000000) goto LAB_006dfa32;
                    uVar24 = 0;
                    while (pMVar13->pLeaves[uVar24] == pMVar14->pLeaves[uVar24]) {
                      uVar24 = uVar24 + 1;
                      if (uVar42 == uVar24) goto LAB_006dfa32;
                    }
                  }
                  else {
                    if (uVar42 <= uVar46) {
LAB_006e0cb8:
                      __assert_fail("nSizeB > nSizeC",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                                    ,0x367,"int Mf_SetCutIsContainedOrder(Mf_Cut_t *, Mf_Cut_t *)");
                    }
                    if (*(uint *)&pMVar14->field_0x10 < 0x8000000) goto LAB_006dfa32;
                    uVar24 = 0;
                    uVar59 = 0;
                    do {
                      if (pMVar14->pLeaves[(int)uVar59] < pMVar13->pLeaves[uVar24]) break;
                      if ((pMVar13->pLeaves[uVar24] == pMVar14->pLeaves[(int)uVar59]) &&
                         (uVar59 = uVar59 + 1, uVar59 == uVar46)) goto LAB_006dfa32;
                      uVar24 = uVar24 + 1;
                    } while (uVar42 != uVar24);
                  }
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar29);
            }
            p->CutCount[2] = p->CutCount[2] + 1.0;
            pJVar10 = p->pPars;
            if (pJVar10->fCutMin == 0) goto LAB_006df94f;
            if (pJVar10->nLutSize < 7) {
              pVVar15 = p->vTtMem;
              uVar42 = (uint)local_1388[2];
              uVar46 = uVar42 >> 1 & 0x3ffffff;
              if (pVVar15->nEntries <= (int)uVar46) goto LAB_006e0c99;
              uVar59 = (uint)puVar36[2];
              uVar47 = uVar59 >> 1 & 0x3ffffff;
              if (pVVar15->nEntries <= (int)uVar47) goto LAB_006e0c99;
              uVar48 = *(uint *)&pMVar43->field_0x10;
              bVar27 = (byte)pVVar15->LogPageSze;
              uVar22 = uVar48 >> 0x1b;
              uVar23 = (ulong)uVar22;
              uVar29 = -(ulong)((uVar42 & 1) != uVar45) ^
                       pVVar15->ppPages[uVar46 >> (bVar27 & 0x1f)]
                       [(int)((uVar46 & pVVar15->PageMask) * pVVar15->nEntrySize)];
              uVar24 = -(ulong)((uVar59 & 1) != uVar41) ^
                       pVVar15->ppPages[uVar47 >> (bVar27 & 0x1f)]
                       [(int)((pVVar15->PageMask & uVar47) * pVVar15->nEntrySize)];
              uVar46 = (uVar42 >> 0x1b) - 1;
              if (0x7ffffff < uVar42 && 0x7ffffff < uVar48) {
                lVar55 = uVar23 * 0x18 + 0x92d308;
                uVar30 = uVar23;
                do {
                  uVar44 = uVar30 - 1;
                  iVar28 = *(int *)((long)local_1388 + (ulong)uVar46 * 4 + 0x14);
                  if (pMVar43->pLeaves[uVar30 - 1] <= iVar28) {
                    if (pMVar43->pLeaves[uVar30 - 1] != iVar28) goto LAB_006e0c5b;
                    if ((long)(int)uVar46 < (long)uVar44) {
                      bVar27 = (char)(-1 << ((byte)uVar46 & 0x1f)) +
                               (char)(1 << ((byte)uVar44 & 0x1f));
                      lVar37 = (ulong)uVar46 * 0x90;
                      uVar29 = (uVar29 & *(ulong *)(lVar55 + lVar37)) >> (bVar27 & 0x3f) |
                               (*(ulong *)(lVar55 + -8 + lVar37) & uVar29) << (bVar27 & 0x3f) |
                               *(ulong *)(lVar55 + -0x10 + lVar37) & uVar29;
                    }
                    uVar46 = uVar46 - 1;
                  }
                } while ((1 < (long)uVar30) &&
                        (lVar55 = lVar55 + -0x18, uVar30 = uVar44, -1 < (int)uVar46));
              }
              if (uVar46 != 0xffffffff) {
LAB_006e0cf6:
                __assert_fail("k == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                              ,0x594,"word Abc_Tt6Expand(word, int *, int, int *, int)");
              }
              uVar42 = (uVar59 >> 0x1b) - 1;
              if (0x7ffffff < uVar59 && 0x7ffffff < uVar48) {
                lVar55 = uVar23 * 0x18 + 0x92d308;
                uVar30 = uVar23;
                do {
                  uVar44 = uVar30 - 1;
                  iVar28 = *(int *)((long)puVar36 + (ulong)uVar42 * 4 + 0x14);
                  if (pMVar43->pLeaves[uVar30 - 1] <= iVar28) {
                    if (pMVar43->pLeaves[uVar30 - 1] != iVar28) {
LAB_006e0c5b:
                      __assert_fail("pCut[i] == pCut0[k]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                    ,0x58f,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                    }
                    if ((long)(int)uVar42 < (long)uVar44) {
                      bVar27 = (char)(-1 << ((byte)uVar42 & 0x1f)) +
                               (char)(1 << ((byte)uVar44 & 0x1f));
                      lVar37 = (ulong)uVar42 * 0x90;
                      uVar24 = (uVar24 & *(ulong *)(lVar55 + lVar37)) >> (bVar27 & 0x3f) |
                               (*(ulong *)(lVar55 + -8 + lVar37) & uVar24) << (bVar27 & 0x3f) |
                               *(ulong *)(lVar55 + -0x10 + lVar37) & uVar24;
                    }
                    uVar42 = uVar42 - 1;
                  }
                } while ((1 < (long)uVar30) &&
                        (lVar55 = lVar55 + -0x18, uVar30 = uVar44, -1 < (int)uVar42));
              }
              if (uVar42 != 0xffffffff) goto LAB_006e0cf6;
              local_1038[0] = uVar24 & uVar29;
              if ((bVar62 && -1 < (int)uVar53) && bVar61) {
                local_1038[0] = uVar24 ^ uVar29;
              }
              uVar42 = (uint)local_1038[0] & 1;
              local_1038[0] = -(ulong)uVar42 ^ local_1038[0];
              uVar46 = 0;
              uVar29 = local_1038[0];
              if (0x7ffffff < uVar48) {
                uVar24 = 0;
                lVar55 = 0x92d318;
                pwVar52 = s_Truths6Neg;
                uVar46 = 0;
                do {
                  bVar27 = (byte)(1 << ((byte)uVar24 & 0x1f));
                  if ((*pwVar52 & (uVar29 >> (bVar27 & 0x3f) ^ uVar29)) != 0) {
                    lVar37 = (long)(int)uVar46;
                    if (lVar37 < (long)uVar24) {
                      pVars[lVar37] = pVars[uVar24];
                      bVar27 = (char)(-1 << ((byte)uVar46 & 0x1f)) + bVar27;
                      lVar37 = lVar37 * 0x90;
                      uVar29 = (uVar29 & *(ulong *)(lVar55 + 8 + lVar37)) >> (bVar27 & 0x3f) |
                               (*(ulong *)(lVar55 + lVar37) & uVar29) << (bVar27 & 0x3f) |
                               *(ulong *)(lVar55 + -8 + lVar37) & uVar29;
                    }
                    uVar46 = uVar46 + 1;
                  }
                  uVar24 = uVar24 + 1;
                  pwVar52 = pwVar52 + 1;
                  lVar55 = lVar55 + 0x18;
                } while (uVar23 != uVar24);
              }
              uVar23 = local_1038[0];
              if ((uVar46 != uVar22) &&
                 (uVar24 = local_12f8[0], uVar23 = uVar29, (int)uVar22 <= (int)uVar46)) {
LAB_006e0dee:
                local_12f8[0] = uVar24;
                __assert_fail("k < nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                              ,0x5b6,"int Abc_Tt6MinBase(word *, int *, int)");
              }
              local_1038[0] = uVar23;
              uVar23 = local_1038[0];
              *(uint *)&pMVar43->field_0x10 =
                   *(uint *)&pMVar43->field_0x10 & 0x7ffffff | uVar46 << 0x1b;
              if ((local_1038[0] & 1) != 0) {
                __assert_fail("(int)(t & 1) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                              ,500,
                              "int Mf_CutComputeTruth6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                             );
              }
              uVar46 = Vec_MemHashInsert(p->vTtMem,local_1038);
              if ((int)uVar46 < 0) {
LAB_006e0d34:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x10b,"int Abc_Var2Lit(int, int)");
              }
              uVar59 = *(uint *)&pMVar43->field_0x10;
              *(uint *)&pMVar43->field_0x10 =
                   uVar59 & 0xf8000000 | uVar42 + (uVar46 & 0x3ffffff) * 2;
              if ((p->pPars->fGenCnf != 0) && (uVar46 == (p->vCnfSizes).nSize)) {
                uVar59 = uVar59 >> 0x1b;
                local_12f8[0] = local_12f8[0] & 0xffffffff00000000;
                Abc_Tt6Isop(uVar23,uVar23,uVar59,(int *)local_12f8);
                Abc_Tt6Isop(~uVar23,~uVar23,uVar59,(int *)local_12f8);
                if (0x40 < (int)(uint)local_12f8[0]) {
LAB_006e0e2c:
                  __assert_fail("nCubes <= 64",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                ,0x76f,"int Abc_Tt6CnfSize(word, int)");
                }
                Vec_IntPush(&p->vCnfSizes,(uint)local_12f8[0]);
              }
              uVar42 = *(uint *)&pMVar43->field_0x10 >> 0x1b;
              bVar60 = uVar42 < uVar22;
              if (!bVar60 && uVar42 != uVar22) {
                __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                              ,0x1fa,
                              "int Mf_CutComputeTruth6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                             );
              }
            }
            else {
              iVar28 = pJVar10->nLutSize;
              uVar42 = 1 << ((char)iVar28 - 6U & 0x1f);
              if (iVar28 < 7) {
                uVar42 = 1;
              }
              pVVar15 = p->vTtMem;
              uVar46 = (uint)local_1388[2];
              uVar59 = uVar46 >> 1 & 0x3ffffff;
              if (pVVar15->nEntries <= (int)uVar59) {
LAB_006e0c99:
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              bVar27 = (byte)pVVar15->LogPageSze;
              uVar23 = puVar36[2];
              uVar47 = (uint)uVar23 >> 1 & 0x3ffffff;
              if (pVVar15->nEntries <= (int)uVar47) goto LAB_006e0c99;
              iVar32 = (uVar59 & pVVar15->PageMask) * pVVar15->nEntrySize;
              pwVar52 = pVVar15->ppPages[uVar59 >> (bVar27 & 0x1f)];
              iVar49 = (uVar47 & pVVar15->PageMask) * pVVar15->nEntrySize;
              pwVar17 = pVVar15->ppPages[uVar47 >> (bVar27 & 0x1f)];
              uVar59 = *(uint *)&pMVar43->field_0x10;
              if ((uVar46 & 1) == uVar45) {
                if (0 < (int)uVar42) {
                  uVar29 = 0;
                  do {
                    local_12f8[uVar29] = pwVar52[(long)iVar32 + uVar29];
                    uVar29 = uVar29 + 1;
                  } while (uVar42 != uVar29);
                }
              }
              else if (0 < (int)uVar42) {
                uVar29 = 0;
                do {
                  local_12f8[uVar29] = ~pwVar52[(long)iVar32 + uVar29];
                  uVar29 = uVar29 + 1;
                } while (uVar42 != uVar29);
              }
              if (((uint)uVar23 & 1) == uVar41) {
                if (0 < (int)uVar42) {
                  uVar23 = 0;
                  do {
                    local_1258[uVar23] = pwVar17[(long)iVar49 + uVar23];
                    uVar23 = uVar23 + 1;
                  } while (uVar42 != uVar23);
                }
              }
              else if (0 < (int)uVar42) {
                uVar23 = 0;
                do {
                  local_1258[uVar23] = ~pwVar17[(long)iVar49 + uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar42 != uVar23);
              }
              uVar47 = uVar59 >> 0x1b;
              uVar23 = (ulong)uVar47;
              uVar48 = (uVar46 >> 0x1b) - 1;
              if (0x7ffffff < uVar46 && 0x7ffffff < uVar59) {
                do {
                  uVar29 = uVar23 - 1;
                  iVar32 = *(int *)((long)local_1388 + (ulong)uVar48 * 4 + 0x14);
                  if (pMVar43->pLeaves[uVar23 - 1] <= iVar32) {
                    if (pMVar43->pLeaves[uVar23 - 1] != iVar32) goto LAB_006e0c7a;
                    if ((long)(int)uVar48 < (long)uVar29) {
                      Abc_TtSwapVars(local_12f8,iVar28,uVar48,(int)uVar29);
                    }
                    uVar48 = uVar48 - 1;
                  }
                } while ((1 < (long)uVar23) && (uVar23 = uVar29, -1 < (int)uVar48));
              }
              if (uVar48 != 0xffffffff) {
LAB_006e0d15:
                __assert_fail("k == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                              ,0x5a3,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
              }
              uVar46 = ((uint)puVar36[2] >> 0x1b) - 1;
              if ((0x7ffffff < (uint)puVar36[2]) && (0x7ffffff < *(uint *)&pMVar43->field_0x10)) {
                uVar23 = (ulong)(*(uint *)&pMVar43->field_0x10 >> 0x1b);
                do {
                  uVar29 = uVar23 - 1;
                  iVar32 = *(int *)((long)puVar36 + (ulong)uVar46 * 4 + 0x14);
                  if (pMVar43->pLeaves[uVar23 - 1] <= iVar32) {
                    if (pMVar43->pLeaves[uVar23 - 1] != iVar32) {
LAB_006e0c7a:
                      __assert_fail("pCut[i] == pCut0[k]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                    ,0x59e,"void Abc_TtExpand(word *, int, int *, int, int *, int)")
                      ;
                    }
                    if ((long)(int)uVar46 < (long)uVar29) {
                      Abc_TtSwapVars(local_1258,iVar28,uVar46,(int)uVar29);
                    }
                    uVar46 = uVar46 - 1;
                  }
                } while ((1 < (long)uVar23) && (uVar23 = uVar29, -1 < (int)uVar46));
              }
              if (uVar46 != 0xffffffff) goto LAB_006e0d15;
              if ((bVar62 && -1 < (int)uVar53) && bVar61) {
                uVar46 = ((uint)local_1258[0] ^ (uint)local_12f8[0]) & 1;
                if (uVar46 == 0) {
                  if (0 < (int)uVar42) {
                    uVar23 = 0;
                    do {
                      local_1038[uVar23] = local_1258[uVar23] ^ local_12f8[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar42 != uVar23);
                  }
                }
                else if (0 < (int)uVar42) {
                  uVar23 = 0;
                  do {
                    local_1038[uVar23] = ~(local_12f8[uVar23] ^ local_1258[uVar23]);
                    uVar23 = uVar23 + 1;
                  } while (uVar42 != uVar23);
                }
              }
              else {
                uVar46 = (uint)local_1258[0] & (uint)local_12f8[0] & 1;
                if (uVar46 == 0) {
                  if (0 < (int)uVar42) {
                    uVar23 = 0;
                    do {
                      local_1038[uVar23] = local_1258[uVar23] & local_12f8[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar42 != uVar23);
                  }
                }
                else if (0 < (int)uVar42) {
                  uVar23 = 0;
                  do {
                    local_1038[uVar23] = ~(local_1258[uVar23] & local_12f8[uVar23]);
                    uVar23 = uVar23 + 1;
                  } while (uVar42 != uVar23);
                }
              }
              iVar32 = Abc_TtMinBase(local_1038,pVars,*(uint *)&pMVar43->field_0x10 >> 0x1b,iVar28);
              *(uint *)&pMVar43->field_0x10 =
                   *(uint *)&pMVar43->field_0x10 & 0x7ffffff | iVar32 << 0x1b;
              if ((local_1038[0] & 1) != 0) {
                __assert_fail("(uTruth[0] & 1) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                              ,0x212,
                              "int Mf_CutComputeTruth(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                             );
              }
              uVar42 = Vec_MemHashInsert(p->vTtMem,local_1038);
              if ((int)uVar42 < 0) goto LAB_006e0d34;
              uVar59 = *(uint *)&pMVar43->field_0x10;
              *(uint *)&pMVar43->field_0x10 =
                   uVar59 & 0xf8000000 | uVar46 + (uVar42 & 0x3ffffff) * 2;
              if (((p->pPars->fGenCnf != 0) && (iVar28 < 9)) && (uVar42 == (p->vCnfSizes).nSize)) {
                uVar59 = uVar59 >> 0x1b;
                local_1158[0] = ~local_1038[0];
                local_1158[1] = ~local_1038[1];
                local_1158[2] = ~CONCAT44(uStack_1024,local_1028);
                local_1158[3] = ~uStack_1020;
                iVar28 = Abc_Tt8Isop(local_1038,local_1038,uVar59,local_10d8);
                iVar32 = Abc_Tt8Isop(local_1158,local_1158,uVar59,local_10d8);
                if (0x100 < iVar32 + iVar28) {
LAB_006e0e0d:
                  __assert_fail("nCubes <= 256",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                ,0x778,"int Abc_Tt8CnfSize(word *, int)");
                }
                Vec_IntPush(&p->vCnfSizes,iVar32 + iVar28);
              }
              uVar42 = *(uint *)&pMVar43->field_0x10 >> 0x1b;
              bVar60 = uVar42 < uVar47;
              if (!bVar60 && uVar42 != uVar47) {
                __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                              ,0x218,
                              "int Mf_CutComputeTruth(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                             );
              }
            }
            if (bVar60) {
              if (*(uint *)&pMVar43->field_0x10 < 0x8000000) {
                uVar23 = 0;
              }
              else {
                uVar29 = 0;
                uVar23 = 0;
                do {
                  uVar23 = uVar23 | 1L << ((ulong)(byte)pVars[uVar29] & 0x3f);
                  uVar29 = uVar29 + 1;
                } while (*(uint *)&pMVar43->field_0x10 >> 0x1b != uVar29);
              }
              pMVar43->Sign = uVar23;
            }
LAB_006df94f:
            uVar42 = *(uint *)&pMVar43->field_0x10;
            uVar46 = uVar42 >> 0x1b;
            pJVar10 = p->pPars;
            if (pJVar10->nLutSize < (int)uVar46) goto LAB_006e0cd7;
            fVar1 = pMVar7->nFlowRefs;
            pMVar43->Delay = 0;
            pMVar43->Flow = 0.0;
            if (0x7ffffff < uVar42) {
              pMVar11 = p->pLfObjs;
              uVar23 = 0;
              fVar63 = 0.0;
              uVar59 = 0;
              do {
                iVar28 = pMVar43->pLeaves[uVar23];
                uVar2 = *(ushort *)&pMVar11[iVar28].field_0xc;
                if (uVar59 <= uVar2) {
                  uVar59 = (uint)uVar2;
                }
                pMVar43->Delay = uVar59;
                fVar63 = fVar63 + pMVar11[iVar28].Flow;
                pMVar43->Flow = fVar63;
                uVar23 = uVar23 + 1;
              } while (uVar46 != uVar23);
            }
            pMVar43->Delay = (pMVar43->Delay + 1) - (uint)(uVar42 < 0x10000000);
            if (uVar42 < 0x10000000) {
              iVar28 = 0;
            }
            else if (pJVar10->fGenCnf == 0) {
              if (pJVar10->fOptEdge == 0) {
                iVar28 = 1;
              }
              else {
                iVar28 = uVar46 + pJVar10->nAreaTuner;
              }
            }
            else {
              uVar42 = uVar42 >> 1 & 0x3ffffff;
              if ((p->vCnfSizes).nSize <= (int)uVar42) goto LAB_006e0d53;
              iVar28 = (p->vCnfSizes).pArray[uVar42];
            }
            pMVar43->Flow = (pMVar43->Flow + (float)iVar28) / fVar1;
            uVar42 = Mf_SetAddCut(local_11d8,iVar58,nCutNum);
            uVar29 = (ulong)uVar42;
LAB_006dfa32:
            puVar36 = puVar36 + 8;
            piVar40 = piVar40 + 0x10;
          } while (puVar36 < local_c38 + (long)iVar31 * 8);
        }
        local_1388 = local_1388 + 8;
        piVar56 = piVar56 + 0x10;
      } while (local_1388 < local_838 + (long)iVar35 * 8);
    }
  }
  else {
    puVar39 = p->pGia->pMuxes;
    uVar53 = 0xffffffff;
    if (puVar39 != (uint *)0x0) {
      uVar42 = puVar39[(uint)iObj];
      if (uVar42 != 0) {
        if ((int)uVar42 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        uVar53 = uVar42 >> 1;
      }
    }
    iVar58 = p->pLfObjs[(int)uVar53].iCutSet;
    if (iVar58 == 0) {
      local_1038[1] = 0;
      local_1028 = 0x8000002;
      uStack_1024 = uVar53;
      local_1038[0] = 1L << ((byte)uVar53 & 0x3f);
      iVar28 = 1;
    }
    else {
      uVar42 = iVar58 >> 0x10;
      if (((int)uVar42 < 0) || ((p->vPages).nSize <= (int)uVar42)) goto LAB_006e0ec7;
      pvVar25 = (p->vPages).pArray[uVar42];
      iVar28 = *(int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
      if (iVar28 < 1) {
        puVar36 = local_1038;
      }
      else {
        piVar56 = (int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
        puVar39 = (uint *)(piVar56 + 1);
        puVar36 = local_1038;
        iVar58 = 0;
        do {
          puVar36[1] = 0;
          uVar42 = *puVar39;
          *(uint *)(puVar36 + 2) = (uint)puVar36[2] & 0xf8000000 | uVar42 >> 5;
          *(uint *)(puVar36 + 2) = *puVar39 << 0x1b | uVar42 >> 5;
          uVar42 = *puVar39 & 0x1f;
          if (uVar42 == 0) {
            uVar23 = 0;
          }
          else {
            uVar24 = 0;
            uVar23 = 0;
            do {
              uVar23 = uVar23 | 1L << ((ulong)(byte)(puVar39 + 1)[uVar24] & 0x3f);
              uVar24 = uVar24 + 1;
            } while (uVar42 != uVar24);
          }
          *puVar36 = uVar23;
          memcpy((void *)((long)puVar36 + 0x14),puVar39 + 1,(ulong)(uVar42 << 2));
          puVar36 = puVar36 + 8;
          iVar58 = iVar58 + 1;
          puVar39 = puVar39 + (ulong)(*puVar39 & 0x1f) + 1;
          iVar28 = *piVar56;
        } while (iVar58 < iVar28);
      }
      if (0xfffffff < local_1028) {
        puVar36[1] = 0;
        *(undefined4 *)(puVar36 + 2) = 0x8000002;
        *(uint *)((long)puVar36 + 0x14) = uVar53;
        *puVar36 = 1L << ((byte)uVar53 & 0x3f);
        iVar28 = iVar28 + 1;
      }
    }
    pGVar8 = p->pGia;
    if (pGVar8->pMuxes == (uint *)0x0) {
      uVar53 = 0;
    }
    else {
      pGVar12 = pGVar8->pObjs;
      if ((pGVar6 < pGVar12) || (pGVar12 + pGVar8->nObjs <= pGVar6)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar53 = pGVar8->pMuxes[(int)((ulong)((long)pGVar6 - (long)pGVar12) >> 2) * -0x55555555];
      if ((int)uVar53 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10d,"int Abc_LitIsCompl(int)");
      }
      uVar53 = uVar53 & 1;
    }
    p->CutCount[0] = (double)(iVar31 * iVar35 * iVar28) + p->CutCount[0];
    if (0 < iVar35) {
      puVar36 = local_838;
      do {
        if (0 < iVar31) {
          local_1368 = local_c38;
          do {
            if (0 < iVar28) {
              puVar57 = local_1038;
              do {
                uVar23 = *local_1368 | *puVar36 | *puVar57;
                uVar23 = uVar23 - (uVar23 >> 1 & 0x5555555555555555);
                uVar23 = (uVar23 >> 2 & 0x3333333333333333) + (uVar23 & 0x3333333333333333);
                if ((int)(uint)(byte)(((uVar23 >> 4) + uVar23 & 0xf0f0f0f0f0f0f0f) *
                                      0x101010101010101 >> 0x38) <= (int)uVar3) {
                  p->CutCount[1] = p->CutCount[1] + 1.0;
                  iVar32 = (int)uVar29;
                  pMVar43 = local_11d8[iVar32];
                  uVar23 = puVar36[2];
                  uVar24 = local_1368[2];
                  uVar30 = puVar57[2];
                  piVar56 = pMVar43->pLeaves;
                  uVar44 = 0;
                  iVar58 = 0x7ffffff;
                  uVar34 = 0;
                  uVar42 = 0;
                  uVar46 = 0;
                  while( true ) {
                    iVar33 = 1000000000;
                    iVar49 = 1000000000;
                    if (uVar46 != (uint)uVar23 >> 0x1b) {
                      iVar49 = *(int *)((long)puVar36 + (ulong)uVar46 * 4 + 0x14);
                    }
                    if (uVar42 != (uint)uVar24 >> 0x1b) {
                      iVar33 = *(int *)((long)local_1368 + (ulong)uVar42 * 4 + 0x14);
                    }
                    iVar51 = 1000000000;
                    if ((uint)uVar34 != (uint)uVar30 >> 0x1b) {
                      iVar51 = *(int *)((long)puVar57 + uVar34 * 4 + 0x14);
                    }
                    iVar50 = iVar33;
                    if (iVar49 < iVar33) {
                      iVar50 = iVar49;
                    }
                    iVar54 = iVar51;
                    if (iVar50 < iVar51) {
                      iVar54 = iVar50;
                    }
                    if (iVar54 == 1000000000) break;
                    if (uVar3 == uVar44) goto LAB_006dfd7b;
                    pMVar43->pLeaves[uVar44] = iVar54;
                    uVar44 = uVar44 + 1;
                    uVar46 = uVar46 + (iVar49 == iVar54);
                    uVar42 = uVar42 + (iVar33 == iVar54);
                    uVar34 = (ulong)((uint)uVar34 + (uint)(iVar51 <= iVar50));
                    iVar58 = iVar58 + 0x8000000;
                  }
                  *(int *)&pMVar43->field_0x10 = iVar58;
                  pMVar43->Sign = *local_1368 | *puVar36 | *puVar57;
LAB_006dfd7b:
                  if (iVar54 == 1000000000) {
                    if (0 < iVar32) {
                      pMVar13 = local_11d8[uVar29];
                      uVar42 = *(uint *)&pMVar13->field_0x10 >> 0x1b;
                      uVar23 = 0;
                      do {
                        pMVar14 = local_11d8[uVar23];
                        uVar46 = *(uint *)&pMVar14->field_0x10 >> 0x1b;
                        if ((uVar46 <= uVar42) && ((pMVar14->Sign & ~pMVar13->Sign) == 0)) {
                          if (uVar42 == uVar46) {
                            if (*(uint *)&pMVar13->field_0x10 < 0x8000000) goto LAB_006e0a0c;
                            uVar24 = 0;
                            while (pMVar13->pLeaves[uVar24] == pMVar14->pLeaves[uVar24]) {
                              uVar24 = uVar24 + 1;
                              if (uVar42 == uVar24) goto LAB_006e0a0c;
                            }
                          }
                          else {
                            if (uVar42 <= uVar46) goto LAB_006e0cb8;
                            if (*(uint *)&pMVar14->field_0x10 < 0x8000000) goto LAB_006e0a0c;
                            uVar24 = 0;
                            uVar59 = 0;
                            do {
                              if (pMVar14->pLeaves[(int)uVar59] < pMVar13->pLeaves[uVar24]) break;
                              if ((pMVar13->pLeaves[uVar24] == pMVar14->pLeaves[(int)uVar59]) &&
                                 (uVar59 = uVar59 + 1, uVar59 == uVar46)) goto LAB_006e0a0c;
                              uVar24 = uVar24 + 1;
                            } while (uVar42 != uVar24);
                          }
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 != uVar29);
                    }
                    p->CutCount[2] = p->CutCount[2] + 1.0;
                    pJVar10 = p->pPars;
                    if (pJVar10->fCutMin != 0) {
                      if (pJVar10->nLutSize < 7) {
                        pVVar15 = p->vTtMem;
                        uVar42 = (uint)puVar36[2];
                        uVar46 = uVar42 >> 1 & 0x3ffffff;
                        iVar58 = pVVar15->nEntries;
                        if (iVar58 <= (int)uVar46) goto LAB_006e0c99;
                        bVar27 = (byte)pVVar15->LogPageSze;
                        uVar59 = (uint)local_1368[2];
                        uVar47 = uVar59 >> 1 & 0x3ffffff;
                        if (iVar58 <= (int)uVar47) goto LAB_006e0c99;
                        uVar48 = (uint)puVar57[2];
                        uVar22 = uVar48 >> 1 & 0x3ffffff;
                        if (iVar58 <= (int)uVar22) goto LAB_006e0c99;
                        uVar4 = *(uint *)&pMVar43->field_0x10;
                        uVar38 = uVar4 >> 0x1b;
                        uVar23 = (ulong)uVar38;
                        ppwVar16 = pVVar15->ppPages;
                        iVar58 = pVVar15->nEntrySize;
                        uVar5 = pVVar15->PageMask;
                        uVar24 = -(ulong)((uVar42 & 1) != uVar45) ^
                                 ppwVar16[uVar46 >> (bVar27 & 0x1f)]
                                 [(int)((uVar46 & uVar5) * iVar58)];
                        uVar29 = -(ulong)((uVar59 & 1) != uVar41) ^
                                 ppwVar16[uVar47 >> (bVar27 & 0x1f)]
                                 [(int)((uVar47 & uVar5) * iVar58)];
                        uVar30 = -(ulong)((uVar48 & 1) != uVar53) ^
                                 ppwVar16[uVar22 >> (bVar27 & 0x1f)]
                                 [(int)((uVar22 & uVar5) * iVar58)];
                        uVar46 = (uVar42 >> 0x1b) - 1;
                        if (0x7ffffff < uVar42 && 0x7ffffff < uVar4) {
                          lVar55 = uVar23 * 0x18 + 0x92d308;
                          uVar44 = uVar23;
                          do {
                            uVar34 = uVar44 - 1;
                            iVar58 = *(int *)((long)puVar36 + (ulong)uVar46 * 4 + 0x14);
                            if (pMVar43->pLeaves[uVar44 - 1] <= iVar58) {
                              if (pMVar43->pLeaves[uVar44 - 1] != iVar58) goto LAB_006e0c5b;
                              if ((long)(int)uVar46 < (long)uVar34) {
                                bVar27 = (char)(-1 << ((byte)uVar46 & 0x1f)) +
                                         (char)(1 << ((byte)uVar34 & 0x1f));
                                lVar37 = (ulong)uVar46 * 0x90;
                                uVar24 = (uVar24 & *(ulong *)(lVar55 + lVar37)) >> (bVar27 & 0x3f) |
                                         (*(ulong *)(lVar55 + -8 + lVar37) & uVar24) <<
                                         (bVar27 & 0x3f) |
                                         *(ulong *)(lVar55 + -0x10 + lVar37) & uVar24;
                              }
                              uVar46 = uVar46 - 1;
                            }
                          } while ((1 < (long)uVar44) &&
                                  (lVar55 = lVar55 + -0x18, uVar44 = uVar34, -1 < (int)uVar46));
                        }
                        if (uVar46 != 0xffffffff) goto LAB_006e0cf6;
                        uVar42 = (uVar59 >> 0x1b) - 1;
                        if (0x7ffffff < uVar59 && 0x7ffffff < uVar4) {
                          lVar55 = uVar23 * 0x18 + 0x92d308;
                          uVar44 = uVar23;
                          do {
                            uVar34 = uVar44 - 1;
                            iVar58 = *(int *)((long)local_1368 + (ulong)uVar42 * 4 + 0x14);
                            if (pMVar43->pLeaves[uVar44 - 1] <= iVar58) {
                              if (pMVar43->pLeaves[uVar44 - 1] != iVar58) goto LAB_006e0c5b;
                              if ((long)(int)uVar42 < (long)uVar34) {
                                bVar27 = (char)(-1 << ((byte)uVar42 & 0x1f)) +
                                         (char)(1 << ((byte)uVar34 & 0x1f));
                                lVar37 = (ulong)uVar42 * 0x90;
                                uVar29 = (uVar29 & *(ulong *)(lVar55 + lVar37)) >> (bVar27 & 0x3f) |
                                         (*(ulong *)(lVar55 + -8 + lVar37) & uVar29) <<
                                         (bVar27 & 0x3f) |
                                         *(ulong *)(lVar55 + -0x10 + lVar37) & uVar29;
                              }
                              uVar42 = uVar42 - 1;
                            }
                          } while ((1 < (long)uVar44) &&
                                  (lVar55 = lVar55 + -0x18, uVar44 = uVar34, -1 < (int)uVar42));
                        }
                        if (uVar42 != 0xffffffff) goto LAB_006e0cf6;
                        uVar42 = (uVar48 >> 0x1b) - 1;
                        if (0x7ffffff < uVar48 && 0x7ffffff < uVar4) {
                          lVar55 = uVar23 * 0x18 + 0x92d308;
                          uVar44 = uVar23;
                          do {
                            uVar34 = uVar44 - 1;
                            iVar58 = *(int *)((long)puVar57 + (ulong)uVar42 * 4 + 0x14);
                            if (pMVar43->pLeaves[uVar44 - 1] <= iVar58) {
                              if (pMVar43->pLeaves[uVar44 - 1] != iVar58) goto LAB_006e0c5b;
                              if ((long)(int)uVar42 < (long)uVar34) {
                                bVar27 = (char)(-1 << ((byte)uVar42 & 0x1f)) +
                                         (char)(1 << ((byte)uVar34 & 0x1f));
                                lVar37 = (ulong)uVar42 * 0x90;
                                uVar30 = (uVar30 & *(ulong *)(lVar55 + lVar37)) >> (bVar27 & 0x3f) |
                                         (*(ulong *)(lVar55 + -8 + lVar37) & uVar30) <<
                                         (bVar27 & 0x3f) |
                                         *(ulong *)(lVar55 + -0x10 + lVar37) & uVar30;
                              }
                              uVar42 = uVar42 - 1;
                            }
                          } while ((1 < (long)uVar44) &&
                                  (lVar55 = lVar55 + -0x18, uVar44 = uVar34, -1 < (int)uVar42));
                        }
                        if (uVar42 != 0xffffffff) goto LAB_006e0cf6;
                        uVar24 = (uVar29 ^ uVar24) & uVar30 ^ uVar24;
                        uVar46 = (uint)uVar24 & 1;
                        uVar24 = -(ulong)uVar46 ^ uVar24;
                        uVar42 = 0;
                        uVar29 = uVar24;
                        if (0x7ffffff < uVar4) {
                          uVar30 = 0;
                          lVar55 = 0x92d318;
                          pwVar52 = s_Truths6Neg;
                          uVar42 = 0;
                          do {
                            bVar27 = (byte)(1 << ((byte)uVar30 & 0x1f));
                            if ((*pwVar52 & (uVar29 >> (bVar27 & 0x3f) ^ uVar29)) != 0) {
                              lVar37 = (long)(int)uVar42;
                              if (lVar37 < (long)uVar30) {
                                piVar56[lVar37] = piVar56[uVar30];
                                bVar27 = (char)(-1 << ((byte)uVar42 & 0x1f)) + bVar27;
                                lVar37 = lVar37 * 0x90;
                                uVar29 = (uVar29 & *(ulong *)(lVar55 + 8 + lVar37)) >>
                                         (bVar27 & 0x3f) |
                                         (*(ulong *)(lVar55 + lVar37) & uVar29) << (bVar27 & 0x3f) |
                                         *(ulong *)(lVar55 + -8 + lVar37) & uVar29;
                              }
                              uVar42 = uVar42 + 1;
                            }
                            uVar30 = uVar30 + 1;
                            pwVar52 = pwVar52 + 1;
                            lVar55 = lVar55 + 0x18;
                          } while (uVar23 != uVar30);
                        }
                        local_12f8[0] = uVar24;
                        if ((uVar42 != uVar38) &&
                           (local_12f8[0] = uVar29, (int)uVar38 <= (int)uVar42)) goto LAB_006e0dee;
                        uVar23 = local_12f8[0];
                        *(uint *)&pMVar43->field_0x10 =
                             *(uint *)&pMVar43->field_0x10 & 0x7ffffff | uVar42 << 0x1b;
                        if ((local_12f8[0] & 1) != 0) {
                          __assert_fail("(int)(t & 1) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                                        ,0x22b,
                                        "int Mf_CutComputeTruthMux6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                       );
                        }
                        uVar42 = Vec_MemHashInsert(p->vTtMem,local_12f8);
                        if ((int)uVar42 < 0) goto LAB_006e0d34;
                        uVar59 = *(uint *)&pMVar43->field_0x10;
                        *(uint *)&pMVar43->field_0x10 =
                             uVar59 & 0xf8000000 | uVar46 + (uVar42 & 0x3ffffff) * 2;
                        if ((p->pPars->fGenCnf != 0) && (uVar42 == (p->vCnfSizes).nSize)) {
                          uVar59 = uVar59 >> 0x1b;
                          local_1258[0]._0_4_ = 0;
                          Abc_Tt6Isop(uVar23,uVar23,uVar59,(int *)local_1258);
                          Abc_Tt6Isop(~uVar23,~uVar23,uVar59,(int *)local_1258);
                          if (0x40 < (int)(uint)local_1258[0]) goto LAB_006e0e2c;
                          Vec_IntPush(&p->vCnfSizes,(uint)local_1258[0]);
                        }
                        uVar42 = *(uint *)&pMVar43->field_0x10 >> 0x1b;
                        bVar61 = uVar42 < uVar38;
                        if (uVar38 < uVar42) {
                          __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                                        ,0x230,
                                        "int Mf_CutComputeTruthMux6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                       );
                        }
                      }
                      else {
                        iVar58 = pJVar10->nLutSize;
                        uVar42 = 1 << ((char)iVar58 - 6U & 0x1f);
                        if (iVar58 < 7) {
                          uVar42 = 1;
                        }
                        uVar23 = (ulong)uVar42;
                        pVVar15 = p->vTtMem;
                        uVar46 = (uint)puVar36[2];
                        uVar59 = uVar46 >> 1 & 0x3ffffff;
                        iVar49 = pVVar15->nEntries;
                        if (iVar49 <= (int)uVar59) goto LAB_006e0c99;
                        bVar27 = (byte)pVVar15->LogPageSze;
                        uVar29 = local_1368[2];
                        uVar47 = (uint)uVar29 >> 1 & 0x3ffffff;
                        if (iVar49 <= (int)uVar47) goto LAB_006e0c99;
                        uVar24 = puVar57[2];
                        uVar48 = (uint)uVar24 >> 1 & 0x3ffffff;
                        if (iVar49 <= (int)uVar48) goto LAB_006e0c99;
                        ppwVar16 = pVVar15->ppPages;
                        iVar49 = pVVar15->nEntrySize;
                        uVar22 = pVVar15->PageMask;
                        iVar33 = (uVar59 & uVar22) * iVar49;
                        pwVar52 = ppwVar16[uVar59 >> (bVar27 & 0x1f)];
                        iVar51 = (uVar47 & uVar22) * iVar49;
                        pwVar17 = ppwVar16[uVar47 >> (bVar27 & 0x1f)];
                        iVar49 = (uVar48 & uVar22) * iVar49;
                        pwVar18 = ppwVar16[uVar48 >> (bVar27 & 0x1f)];
                        uVar59 = *(uint *)&pMVar43->field_0x10;
                        if ((uVar46 & 1) == uVar45) {
                          if (0 < (int)uVar42) {
                            uVar30 = 0;
                            do {
                              local_1258[uVar30] = pwVar52[(long)iVar33 + uVar30];
                              uVar30 = uVar30 + 1;
                            } while (uVar23 != uVar30);
                          }
                        }
                        else if (0 < (int)uVar42) {
                          uVar30 = 0;
                          do {
                            local_1258[uVar30] = ~pwVar52[(long)iVar33 + uVar30];
                            uVar30 = uVar30 + 1;
                          } while (uVar23 != uVar30);
                        }
                        if (((uint)uVar29 & 1) == uVar41) {
                          if (0 < (int)uVar42) {
                            uVar29 = 0;
                            do {
                              local_10d8[uVar29] = pwVar17[(long)iVar51 + uVar29];
                              uVar29 = uVar29 + 1;
                            } while (uVar23 != uVar29);
                          }
                        }
                        else if (0 < (int)uVar42) {
                          uVar29 = 0;
                          do {
                            local_10d8[uVar29] = ~pwVar17[(long)iVar51 + uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar23 != uVar29);
                        }
                        if (((uint)uVar24 & 1) == uVar53) {
                          if (0 < (int)uVar42) {
                            uVar29 = 0;
                            do {
                              local_1158[uVar29] = pwVar18[(long)iVar49 + uVar29];
                              uVar29 = uVar29 + 1;
                            } while (uVar42 != uVar29);
                          }
                        }
                        else if (0 < (int)uVar42) {
                          uVar29 = 0;
                          do {
                            local_1158[uVar29] = ~pwVar18[(long)iVar49 + uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar23 != uVar29);
                        }
                        uVar47 = uVar59 >> 0x1b;
                        uVar29 = (ulong)uVar47;
                        uVar48 = (uVar46 >> 0x1b) - 1;
                        if (0x7ffffff < uVar46 && 0x7ffffff < uVar59) {
                          do {
                            uVar24 = uVar29 - 1;
                            iVar49 = *(int *)((long)puVar36 + (ulong)uVar48 * 4 + 0x14);
                            if (pMVar43->pLeaves[uVar29 - 1] <= iVar49) {
                              if (pMVar43->pLeaves[uVar29 - 1] != iVar49) goto LAB_006e0c7a;
                              if ((long)(int)uVar48 < (long)uVar24) {
                                Abc_TtSwapVars(local_1258,iVar58,uVar48,(int)uVar24);
                              }
                              uVar48 = uVar48 - 1;
                            }
                          } while ((1 < (long)uVar29) && (uVar29 = uVar24, -1 < (int)uVar48));
                        }
                        if (uVar48 != 0xffffffff) goto LAB_006e0d15;
                        uVar46 = ((uint)local_1368[2] >> 0x1b) - 1;
                        if ((0x7ffffff < (uint)local_1368[2]) &&
                           (0x7ffffff < *(uint *)&pMVar43->field_0x10)) {
                          uVar29 = (ulong)(*(uint *)&pMVar43->field_0x10 >> 0x1b);
                          do {
                            uVar24 = uVar29 - 1;
                            iVar49 = *(int *)((long)local_1368 + (ulong)uVar46 * 4 + 0x14);
                            if (pMVar43->pLeaves[uVar29 - 1] <= iVar49) {
                              if (pMVar43->pLeaves[uVar29 - 1] != iVar49) goto LAB_006e0c7a;
                              if ((long)(int)uVar46 < (long)uVar24) {
                                Abc_TtSwapVars(local_10d8,iVar58,uVar46,(int)uVar24);
                              }
                              uVar46 = uVar46 - 1;
                            }
                          } while ((1 < (long)uVar29) && (uVar29 = uVar24, -1 < (int)uVar46));
                        }
                        if (uVar46 != 0xffffffff) goto LAB_006e0d15;
                        uVar46 = ((uint)puVar57[2] >> 0x1b) - 1;
                        if ((0x7ffffff < (uint)puVar57[2]) &&
                           (0x7ffffff < *(uint *)&pMVar43->field_0x10)) {
                          uVar29 = (ulong)(*(uint *)&pMVar43->field_0x10 >> 0x1b);
                          do {
                            uVar24 = uVar29 - 1;
                            iVar49 = *(int *)((long)puVar57 + (ulong)uVar46 * 4 + 0x14);
                            if (pMVar43->pLeaves[uVar29 - 1] <= iVar49) {
                              if (pMVar43->pLeaves[uVar29 - 1] != iVar49) goto LAB_006e0c7a;
                              if ((long)(int)uVar46 < (long)uVar24) {
                                Abc_TtSwapVars(local_1158,iVar58,uVar46,(int)uVar24);
                              }
                              uVar46 = uVar46 - 1;
                            }
                          } while ((1 < (long)uVar29) && (uVar29 = uVar24, -1 < (int)uVar46));
                        }
                        if (uVar46 != 0xffffffff) goto LAB_006e0d15;
                        if (0 < (int)uVar42) {
                          uVar29 = 0;
                          do {
                            local_12f8[uVar29] =
                                 (local_10d8[uVar29] ^ local_1258[uVar29]) & local_1158[uVar29] ^
                                 local_1258[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar23 != uVar29);
                        }
                        uVar46 = (uint)local_12f8[0] & 1;
                        if ((local_12f8[0] & 1) != 0 && 0 < (int)uVar42) {
                          uVar29 = 0;
                          do {
                            local_12f8[uVar29] = ~local_12f8[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar23 != uVar29);
                        }
                        iVar49 = Abc_TtMinBase(local_12f8,piVar56,
                                               *(uint *)&pMVar43->field_0x10 >> 0x1b,iVar58);
                        *(uint *)&pMVar43->field_0x10 =
                             *(uint *)&pMVar43->field_0x10 & 0x7ffffff | iVar49 << 0x1b;
                        if ((local_12f8[0] & 1) != 0) {
                          __assert_fail("(uTruth[0] & 1) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                                        ,0x249,
                                        "int Mf_CutComputeTruthMux(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                       );
                        }
                        uVar42 = Vec_MemHashInsert(p->vTtMem,local_12f8);
                        if ((int)uVar42 < 0) goto LAB_006e0d34;
                        uVar59 = *(uint *)&pMVar43->field_0x10;
                        *(uint *)&pMVar43->field_0x10 =
                             (uVar59 & 0xf8000000) + (uVar42 & 0x3ffffff) * 2 | uVar46;
                        if (((p->pPars->fGenCnf != 0) && (iVar58 < 9)) &&
                           (uVar42 == (p->vCnfSizes).nSize)) {
                          uVar59 = uVar59 >> 0x1b;
                          local_1278 = ~local_12f8[0];
                          local_1270 = ~local_12f8[1];
                          local_1268 = ~local_12f8[2];
                          local_1260 = ~local_12f8[3];
                          iVar58 = Abc_Tt8Isop(local_12f8,local_12f8,uVar59,local_1058);
                          iVar49 = Abc_Tt8Isop(&local_1278,&local_1278,uVar59,local_1058);
                          if (0x100 < iVar49 + iVar58) goto LAB_006e0e0d;
                          Vec_IntPush(&p->vCnfSizes,iVar49 + iVar58);
                        }
                        uVar42 = *(uint *)&pMVar43->field_0x10 >> 0x1b;
                        bVar61 = uVar42 < uVar47;
                        if (!bVar61 && uVar42 != uVar47) {
                          __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                                        ,0x24e,
                                        "int Mf_CutComputeTruthMux(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                       );
                        }
                      }
                      if (bVar61) {
                        if (*(uint *)&pMVar43->field_0x10 < 0x8000000) {
                          uVar23 = 0;
                        }
                        else {
                          uVar29 = 0;
                          uVar23 = 0;
                          do {
                            uVar23 = uVar23 | 1L << ((ulong)(byte)piVar56[uVar29] & 0x3f);
                            uVar29 = uVar29 + 1;
                          } while (*(uint *)&pMVar43->field_0x10 >> 0x1b != uVar29);
                        }
                        pMVar43->Sign = uVar23;
                      }
                    }
                    uVar42 = *(uint *)&pMVar43->field_0x10;
                    uVar46 = uVar42 >> 0x1b;
                    pJVar10 = p->pPars;
                    if (pJVar10->nLutSize < (int)uVar46) goto LAB_006e0cd7;
                    fVar1 = pMVar7->nFlowRefs;
                    pMVar43->Delay = 0;
                    pMVar43->Flow = 0.0;
                    if (0x7ffffff < uVar42) {
                      pMVar11 = p->pLfObjs;
                      uVar23 = 0;
                      fVar63 = 0.0;
                      uVar59 = 0;
                      do {
                        iVar58 = pMVar43->pLeaves[uVar23];
                        uVar2 = *(ushort *)&pMVar11[iVar58].field_0xc;
                        if (uVar59 <= uVar2) {
                          uVar59 = (uint)uVar2;
                        }
                        pMVar43->Delay = uVar59;
                        fVar63 = fVar63 + pMVar11[iVar58].Flow;
                        pMVar43->Flow = fVar63;
                        uVar23 = uVar23 + 1;
                      } while (uVar46 != uVar23);
                    }
                    pMVar43->Delay = (pMVar43->Delay + 1) - (uint)(uVar42 < 0x10000000);
                    if (uVar42 < 0x10000000) {
                      iVar58 = 0;
                    }
                    else if (pJVar10->fGenCnf == 0) {
                      if (pJVar10->fOptEdge == 0) {
                        iVar58 = 1;
                      }
                      else {
                        iVar58 = uVar46 + pJVar10->nAreaTuner;
                      }
                    }
                    else {
                      uVar42 = uVar42 >> 1 & 0x3ffffff;
                      if ((p->vCnfSizes).nSize <= (int)uVar42) goto LAB_006e0d53;
                      iVar58 = (p->vCnfSizes).pArray[uVar42];
                    }
                    pMVar43->Flow = (pMVar43->Flow + (float)iVar58) / fVar1;
                    uVar42 = Mf_SetAddCut(local_11d8,iVar32,nCutNum);
                    uVar29 = (ulong)uVar42;
                  }
                }
LAB_006e0a0c:
                puVar57 = puVar57 + 8;
              } while (puVar57 < local_1038 + (long)iVar28 * 8);
            }
            local_1368 = local_1368 + 8;
          } while (local_1368 < local_c38 + (long)iVar31 * 8);
        }
        puVar36 = puVar36 + 8;
      } while (puVar36 < local_838 + (long)iVar35 * 8);
    }
  }
  pMVar7->Flow = local_11d8[0]->Flow;
  *(short *)&pMVar7->field_0xc = (short)local_11d8[0]->Delay;
  iVar58 = (int)uVar29;
  iVar28 = 1;
  if (0 < iVar58) {
    uVar23 = 0;
    do {
      iVar28 = iVar28 + (*(uint *)&local_11d8[uVar23]->field_0x10 >> 0x1b) + 1;
      uVar23 = uVar23 + 1;
    } while (uVar29 != uVar23);
  }
  if (0xffff < (p->iCur & 0xffffU) + iVar28) {
    p->iCur = (p->iCur & 0xffff0000U) + 0x10000;
  }
  uVar3 = (p->vPages).nSize;
  if (uVar3 == (int)*(short *)((long)&p->iCur + 2)) {
    pvVar25 = malloc(0x40000);
    uVar45 = (p->vPages).nCap;
    if (uVar3 == uVar45) {
      if ((int)uVar45 < 0x10) {
        ppvVar26 = (p->vPages).pArray;
        if (ppvVar26 == (void **)0x0) {
          ppvVar26 = (void **)malloc(0x80);
        }
        else {
          ppvVar26 = (void **)realloc(ppvVar26,0x80);
        }
        (p->vPages).pArray = ppvVar26;
        iVar35 = 0x10;
      }
      else {
        iVar35 = uVar45 * 2;
        if (iVar35 <= (int)uVar45) goto LAB_006e0b6e;
        ppvVar26 = (p->vPages).pArray;
        if (ppvVar26 == (void **)0x0) {
          ppvVar26 = (void **)malloc((ulong)uVar45 << 4);
        }
        else {
          ppvVar26 = (void **)realloc(ppvVar26,(ulong)uVar45 << 4);
        }
        (p->vPages).pArray = ppvVar26;
      }
      (p->vPages).nCap = iVar35;
    }
LAB_006e0b6e:
    iVar35 = (p->vPages).nSize;
    (p->vPages).nSize = iVar35 + 1;
    (p->vPages).pArray[iVar35] = pvVar25;
  }
  uVar3 = p->iCur;
  p->iCur = iVar28 + uVar3;
  uVar45 = (int)uVar3 >> 0x10;
  if ((-1 < (int)uVar45) && ((int)uVar45 < (p->vPages).nSize)) {
    pvVar25 = (p->vPages).pArray[uVar45];
    *(int *)((long)pvVar25 + (ulong)(uVar3 & 0xffff) * 4) = iVar58;
    if (0 < iVar58) {
      puVar39 = (uint *)((long)pvVar25 + (ulong)(uVar3 & 0xffff) * 4);
      uVar23 = 0;
      do {
        pMVar43 = local_11d8[uVar23];
        puVar39[1] = *(uint *)&pMVar43->field_0x10 << 5 | *(uint *)&pMVar43->field_0x10 >> 0x1b;
        memcpy(puVar39 + 2,pMVar43->pLeaves,
               (ulong)(*(uint *)&pMVar43->field_0x10 >> 0x19 & 0xfffffffc));
        puVar39 = puVar39 + 1 + (*(uint *)&pMVar43->field_0x10 >> 0x1b);
        uVar23 = uVar23 + 1;
      } while (uVar29 != uVar23);
    }
    pMVar7->iCutSet = uVar3;
    if ((0 < iVar58) && (iVar58 < (int)nCutNum)) {
      p->nCutCounts[*(uint *)&local_11d8[0]->field_0x10 >> 0x1b] =
           p->nCutCounts[*(uint *)&local_11d8[0]->field_0x10 >> 0x1b] + 1;
      p->CutCount[3] = (double)iVar58 + p->CutCount[3];
      return;
    }
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                  ,0x423,"void Mf_ObjMergeOrder(Mf_Man_t *, int)");
  }
LAB_006e0ec7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Mf_ObjMergeOrder( Mf_Man_t * p, int iObj )
{
    Mf_Cut_t pCuts0[MF_CUT_MAX], pCuts1[MF_CUT_MAX], pCuts[MF_CUT_MAX], * pCutsR[MF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    Mf_Obj_t * pBest = Mf_ManObj(p, iObj);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Mf_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Mf_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Mf_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsR = 0;
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Mf_Cut_t pCuts2[MF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Mf_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Mf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            if ( pCutsR[nCutsR]->iFunc >= 0 )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Mf_Cut_t pCuts2[MF_CUT_MAX];
        int nCuts2  = Mf_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Mf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Mf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Mf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Mf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Mf_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Mf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Mf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Mf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Mf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Mf_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Mf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
//    if ( iObj % 1000 == 0 )
//    if ( iObj == 474 )
    {
        printf( "*** Obj = %d  FlowRefs = %.2f  MapRefs = %2d\n", iObj, pBest->nFlowRefs, pBest->nMapRefs );
        for ( i = 0; i < nCutsR; i++ )
            Mf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    } 
    // store the cutset
    pBest->Flow = pCutsR[0]->Flow;
    pBest->Delay = pCutsR[0]->Delay;
    pBest->iCutSet = Mf_ManSaveCuts( p, pCutsR, nCutsR );
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Mf_SetCheckArray(pCutsR, nCutsR) );
    p->nCutCounts[pCutsR[0]->nLeaves]++;
    p->CutCount[3] += nCutsR;
}